

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_setToUCallBack_63
               (UConverter *converter,UConverterToUCallback newAction,void *newContext,
               UConverterToUCallback *oldAction,void **oldContext,UErrorCode *err)

{
  UBool UVar1;
  UErrorCode *err_local;
  void **oldContext_local;
  UConverterToUCallback *oldAction_local;
  void *newContext_local;
  UConverterToUCallback newAction_local;
  UConverter *converter_local;
  
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    if (oldAction != (UConverterToUCallback *)0x0) {
      *oldAction = converter->fromCharErrorBehaviour;
    }
    converter->fromCharErrorBehaviour = newAction;
    if (oldContext != (void **)0x0) {
      *oldContext = converter->toUContext;
    }
    converter->toUContext = newContext;
  }
  return;
}

Assistant:

U_CAPI void    U_EXPORT2
ucnv_setToUCallBack (UConverter * converter,
                            UConverterToUCallback newAction,
                            const void* newContext,
                            UConverterToUCallback *oldAction,
                            const void** oldContext,
                            UErrorCode * err)
{
    if (U_FAILURE (*err))
        return;
    if (oldAction) *oldAction = converter->fromCharErrorBehaviour;
    converter->fromCharErrorBehaviour = newAction;
    if (oldContext) *oldContext = converter->toUContext;
    converter->toUContext = newContext;
}